

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O1

void Assimp::FBX::Tokenize(TokenList *output_tokens,char *input)

{
  pointer *pppTVar1;
  byte bVar2;
  bool bVar3;
  anon_union_8_2_0c989700_for_Token_4 aVar4;
  anon_union_8_2_0c989700_for_Token_4 aVar5;
  uint column;
  uint line;
  bool bVar6;
  iterator __position;
  bool bVar7;
  bool bVar8;
  char *token_begin;
  char *token_end;
  byte *local_60;
  byte *local_58;
  string local_50;
  
  local_60 = (byte *)0x0;
  local_58 = (byte *)0x0;
  column = 1;
  bVar7 = false;
  bVar8 = false;
  bVar6 = false;
  line = 1;
  do {
    bVar2 = *input;
    bVar3 = true;
    if ((1 < bVar2 - 0xc) && (bVar2 != 10)) {
      if (bVar2 == 0) {
        return;
      }
      bVar3 = false;
    }
    if (bVar3) {
      bVar7 = false;
      column = 0;
    }
    line = line + bVar3;
    if (!bVar7) {
      if (bVar8) {
        if (bVar2 == 0x22) {
          local_58 = (byte *)input;
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_60,(char **)&local_58,line,column,TokenType_DATA,
                     false);
          bVar8 = false;
LAB_0016e387:
          bVar6 = false;
        }
      }
      else if (bVar2 < 0x22) {
        if (bVar2 < 0xc) {
          if ((bVar2 - 9 < 2) || (bVar2 == 0)) {
LAB_0016e359:
            if (local_60 != (byte *)0x0) {
              anon_unknown_3::ProcessDataToken
                        (output_tokens,(char **)&local_60,(char **)&local_58,line,column,
                         TokenType_DATA,false);
            }
            goto LAB_0016e387;
          }
        }
        else if ((bVar2 - 0xc < 2) || (bVar2 == 0x20)) goto LAB_0016e359;
LAB_0016e539:
        if (local_60 == (byte *)0x0) {
          local_60 = (byte *)input;
        }
        bVar6 = true;
        local_58 = (byte *)input;
      }
      else if (bVar2 < 0x3b) {
        if (bVar2 == 0x22) {
          if (local_60 != (byte *)0x0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unexpected double-quote","");
            anon_unknown_3::TokenizeError(&local_50,line,column);
          }
          bVar8 = true;
          local_60 = (byte *)input;
        }
        else if (bVar2 == 0x2c) {
          if (bVar6) {
            anon_unknown_3::ProcessDataToken
                      (output_tokens,(char **)&local_60,(char **)&local_58,line,column,
                       TokenType_DATA,true);
          }
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
          ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
          ((Token *)local_50._M_dataplus._M_p)->type = TokenType_COMMA;
          aVar4.line._4_4_ = 0;
          aVar4.line._0_4_ = line;
          ((Token *)local_50._M_dataplus._M_p)->field_3 = aVar4;
          ((Token *)local_50._M_dataplus._M_p)->column = column;
          __position._M_current =
               (output_tokens->
               super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (output_tokens->
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0016e50e;
          *__position._M_current = (Token *)local_50._M_dataplus._M_p;
          pppTVar1 = &(output_tokens->
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
        else {
          if (bVar2 != 0x3a) goto LAB_0016e539;
          if (!bVar6) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"unexpected colon","");
            anon_unknown_3::TokenizeError(&local_50,line,column);
          }
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_60,(char **)&local_58,line,column,TokenType_KEY,
                     true);
        }
      }
      else if (bVar2 == 0x3b) {
        anon_unknown_3::ProcessDataToken
                  (output_tokens,(char **)&local_60,(char **)&local_58,line,column,TokenType_DATA,
                   false);
        bVar7 = true;
      }
      else {
        if (bVar2 == 0x7b) {
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_60,(char **)&local_58,line,column,TokenType_DATA,
                     false);
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
          ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
          ((Token *)local_50._M_dataplus._M_p)->type = TokenType_OPEN_BRACKET;
        }
        else {
          if (bVar2 != 0x7d) goto LAB_0016e539;
          anon_unknown_3::ProcessDataToken
                    (output_tokens,(char **)&local_60,(char **)&local_58,line,column,TokenType_DATA,
                     false);
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          ((Token *)local_50._M_dataplus._M_p)->sbegin = input;
          ((Token *)local_50._M_dataplus._M_p)->send = (char *)((byte *)input + 1);
          ((Token *)local_50._M_dataplus._M_p)->type = TokenType_CLOSE_BRACKET;
        }
        aVar5.line._4_4_ = 0;
        aVar5.line._0_4_ = line;
        ((Token *)local_50._M_dataplus._M_p)->field_3 = aVar5;
        ((Token *)local_50._M_dataplus._M_p)->column = column;
        __position._M_current =
             (output_tokens->
             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (output_tokens->
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0016e50e:
          std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
          _M_realloc_insert<Assimp::FBX::Token_const*>
                    ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
                     output_tokens,__position,(Token **)&local_50);
        }
        else {
          *__position._M_current = (Token *)local_50._M_dataplus._M_p;
          pppTVar1 = &(output_tokens->
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
    }
    column = column + (uint)(*input == 9) * 3 + 1;
    input = (char *)((byte *)input + 1);
  } while( true );
}

Assistant:

void Tokenize(TokenList& output_tokens, const char* input)
{
    ai_assert(input);

    // line and column numbers numbers are one-based
    unsigned int line = 1;
    unsigned int column = 1;

    bool comment = false;
    bool in_double_quotes = false;
    bool pending_data_token = false;

    const char* token_begin = NULL, *token_end = NULL;
    for (const char* cur = input;*cur;column += (*cur == '\t' ? ASSIMP_FBX_TAB_WIDTH : 1), ++cur) {
        const char c = *cur;

        if (IsLineEnd(c)) {
            comment = false;

            column = 0;
            ++line;
        }

        if(comment) {
            continue;
        }

        if(in_double_quotes) {
            if (c == '\"') {
                in_double_quotes = false;
                token_end = cur;

                ProcessDataToken(output_tokens,token_begin,token_end,line,column);
                pending_data_token = false;
            }
            continue;
        }

        switch(c)
        {
        case '\"':
            if (token_begin) {
                TokenizeError("unexpected double-quote", line, column);
            }
            token_begin = cur;
            in_double_quotes = true;
            continue;

        case ';':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            comment = true;
            continue;

        case '{':
            ProcessDataToken(output_tokens,token_begin,token_end, line, column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_OPEN_BRACKET,line,column));
            continue;

        case '}':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_CLOSE_BRACKET,line,column));
            continue;

        case ',':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_DATA,true);
            }
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_COMMA,line,column));
            continue;

        case ':':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_KEY,true);
            }
            else {
                TokenizeError("unexpected colon", line, column);
            }
            continue;
        }

        if (IsSpaceOrNewLine(c)) {

            if (token_begin) {
                // peek ahead and check if the next token is a colon in which
                // case this counts as KEY token.
                TokenType type = TokenType_DATA;
                for (const char* peek = cur;  *peek && IsSpaceOrNewLine(*peek); ++peek) {
                    if (*peek == ':') {
                        type = TokenType_KEY;
                        cur = peek;
                        break;
                    }
                }

                ProcessDataToken(output_tokens,token_begin,token_end,line,column,type);
            }

            pending_data_token = false;
        }
        else {
            token_end = cur;
            if (!token_begin) {
                token_begin = cur;
            }

            pending_data_token = true;
        }
    }
}